

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

int fmt::v8::getpagesize(void)

{
  long lVar1;
  undefined8 uVar2;
  uint *puVar3;
  format_string<> fmt;
  long size;
  
  lVar1 = sysconf(0x1e);
  if (lVar1 < 0) {
    uVar2 = __cxa_allocate_exception(0x20);
    puVar3 = (uint *)__errno_location();
    fmt.str_.data_ = (char *)(ulong)*puVar3;
    fmt.str_.size_ = (size_t)"cannot get memory page size";
    system_error<>((int)uVar2,fmt);
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return (int)lVar1;
}

Assistant:

long getpagesize() {
#  ifdef _WIN32
  SYSTEM_INFO si;
  GetSystemInfo(&si);
  return si.dwPageSize;
#  else
  long size = FMT_POSIX_CALL(sysconf(_SC_PAGESIZE));
  if (size < 0) FMT_THROW(system_error(errno, "cannot get memory page size"));
  return size;
#  endif
}